

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O1

VmInstruction * UnderlyingValue(VmInstruction *inst)

{
  VmInstructionType VVar1;
  VmInstruction *pVVar2;
  VmValueType VVar3;
  VmInstruction *pVVar4;
  VmValueType VVar5;
  VmInstruction *inst_00;
  ulong uVar6;
  ulong uVar7;
  VmValue *pVVar8;
  bool bVar9;
  bool bVar10;
  
  while( true ) {
    VVar1 = inst->cmd;
    pVVar2 = (VmInstruction *)(ulong)VVar1;
    if (VVar1 != VM_INST_MOV) break;
    if ((inst->arguments).count == 0) {
LAB_001bdcdf:
      __assert_fail("index < count",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                    ,0x199,
                    "T &SmallArray<VmValue *, 4>::operator[](unsigned int) [T = VmValue *, N = 4]");
    }
    inst = (VmInstruction *)*(inst->arguments).data;
    if ((inst == (VmInstruction *)0x0) || ((inst->super_VmValue).typeID != 2)) {
      inst = (VmInstruction *)0x0;
    }
    if (inst == (VmInstruction *)0x0) {
      __assert_fail("argument",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                    ,0x1d05,"VmInstruction *UnderlyingValue(VmInstruction *)");
    }
  }
  if (VVar1 == VM_INST_DEF) {
    bVar9 = (inst->super_VmValue).users.count != 0;
    if (bVar9) {
      uVar7 = 0;
      do {
        pVVar8 = (inst->super_VmValue).users.data[uVar7];
        if ((pVVar8 == (VmValue *)0x0) || (pVVar8->typeID != 2)) {
          pVVar8 = (VmValue *)0x0;
        }
        bVar10 = true;
        if ((pVVar8 != (VmValue *)0x0) && (*(int *)&pVVar8[1]._vptr_VmValue == 0x51)) {
          VVar3 = pVVar8[1].type.type;
          bVar10 = VVar3 == VM_TYPE_VOID;
          if (!bVar10) {
            uVar6 = 0;
            do {
              pVVar4 = *(VmInstruction **)(*(long *)&pVVar8[1].typeID + uVar6 * 8);
              if ((pVVar4 == (VmInstruction *)0x0) || ((pVVar4->super_VmValue).typeID != 2)) {
                pVVar4 = (VmInstruction *)0x0;
              }
              VVar5 = (int)uVar6 + VM_TYPE_INT;
              if (VVar3 <= VVar5) goto LAB_001bdcdf;
              inst_00 = *(VmInstruction **)(*(long *)&pVVar8[1].typeID + (ulong)VVar5 * 8);
              if ((inst_00 == (VmInstruction *)0x0) || ((inst_00->super_VmValue).typeID != 2)) {
                inst_00 = (VmInstruction *)0x0;
              }
              if (pVVar4 == (VmInstruction *)0x0) {
                __assert_fail("destination",
                              "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                              ,0x1d17,"VmInstruction *UnderlyingValue(VmInstruction *)");
              }
              if (inst_00 == (VmInstruction *)0x0) {
                __assert_fail("source",
                              "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                              ,0x1d18,"VmInstruction *UnderlyingValue(VmInstruction *)");
              }
              if (pVVar4 == inst) {
                pVVar2 = UnderlyingValue(inst_00);
                break;
              }
              VVar5 = (int)uVar6 + VM_TYPE_DOUBLE;
              uVar6 = (ulong)VVar5;
              VVar3 = pVVar8[1].type.type;
              bVar10 = VVar5 >= VVar3;
            } while (VVar5 < VVar3);
          }
        }
        if (!bVar10) break;
        uVar7 = uVar7 + 1;
        bVar9 = uVar7 < (inst->super_VmValue).users.count;
      } while (bVar9);
    }
    if (bVar9) {
      return pVVar2;
    }
  }
  return inst;
}

Assistant:

VmInstruction* UnderlyingValue(VmInstruction *inst)
{
	if(inst->cmd == VM_INST_MOV)
	{
		VmInstruction *argument = getType<VmInstruction>(inst->arguments[0]);

		assert(argument);

		return UnderlyingValue(argument);
	}

	if(inst->cmd == VM_INST_DEF)
	{
		for(unsigned userPos = 0; userPos < inst->users.size(); userPos++)
		{
			VmInstruction *instruction = getType<VmInstruction>(inst->users[userPos]);

			if(instruction && instruction->cmd == VM_INST_PARALLEL_COPY)
			{
				for(unsigned argumentPos = 0; argumentPos < instruction->arguments.size(); argumentPos += 2)
				{
					VmInstruction *destination = getType<VmInstruction>(instruction->arguments[argumentPos]);
					VmInstruction *source = getType<VmInstruction>(instruction->arguments[argumentPos + 1]);

					assert(destination);
					assert(source);

					if(inst == destination)
						return UnderlyingValue(source);
				}
			}
		}
	}

	return inst;
}